

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O3

bool __thiscall
slang::ast::AssertionExpr::checkAssertionCall
          (AssertionExpr *this,CallExpression *call,ASTContext *context,DiagCode outArgCode,
          DiagCode refArgCode,DiagCode nonVoidCode,SourceRange range,bool isInsideSequence)

{
  int iVar1;
  Type *pTVar2;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> pSVar3;
  long lVar4;
  size_t sVar5;
  pointer ppFVar6;
  SubroutineKind SVar7;
  uint uVar8;
  Type *pTVar9;
  Diagnostic *pDVar10;
  variant_alternative_t<1UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *pvVar11;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar12;
  Symbol *pSVar13;
  Diagnostic *this_00;
  SourceLocation noteLocation;
  long lVar14;
  string_view arg;
  
  if ((nonVoidCode != (DiagCode)0x0) || ((char)this[6].kind == Simple)) {
    SVar7 = CallExpression::getSubroutineKind((CallExpression *)this);
    if (SVar7 == Function) {
      pTVar2 = (Type *)this->syntax;
      pTVar9 = pTVar2->canonical;
      if (pTVar9 == (Type *)0x0) {
        Type::resolveCanonical(pTVar2);
        pTVar9 = pTVar2->canonical;
      }
      if ((pTVar9->super_Symbol).kind != VoidType) {
        pTVar2 = (Type *)this->syntax;
        pTVar9 = pTVar2->canonical;
        if (pTVar9 == (Type *)0x0) {
          Type::resolveCanonical(pTVar2);
          pTVar9 = pTVar2->canonical;
        }
        if ((pTVar9->super_Symbol).kind != ErrorType) {
          pDVar10 = ASTContext::addDiag((ASTContext *)call,refArgCode,range);
          arg = CallExpression::getSubroutineName((CallExpression *)this);
          Diagnostic::operator<<(pDVar10,arg);
        }
      }
    }
    if ((char)this[6].kind == Simple) {
      pvVar11 = std::
                get<1ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                          ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                            *)(this + 3));
      if (((pvVar11->subroutine).ptr)->hasOutputArgs == true) {
        ASTContext::addDiag((ASTContext *)call,SUB84(context,0),range);
        return false;
      }
      return true;
    }
  }
  ppSVar12 = std::
             get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                       ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                         *)(this + 3));
  pSVar3 = *ppSVar12;
  lVar4 = *(long *)(this + 7);
  if ((pSVar3->super_Scope).deferredMemberIndex != Invalid) {
    Scope::elaborate(&pSVar3->super_Scope);
  }
  sVar5 = (pSVar3->arguments)._M_extent._M_extent_value;
  if (sVar5 != 0) {
    ppFVar6 = (pSVar3->arguments)._M_ptr;
    lVar14 = 0;
    do {
      iVar1 = *(int *)(*(long *)((long)ppFVar6 + lVar14) + 0x158);
      if (iVar1 == 3) {
        pSVar13 = Expression::getSymbolReference(*(Expression **)(lVar4 + lVar14),true);
        if ((((pSVar13 != (Symbol *)0x0) && (uVar8 = pSVar13->kind - Variable, uVar8 < 0x19)) &&
            ((0x1800c0fU >> (uVar8 & 0x1f) & 1) != 0)) && (*(int *)&pSVar13[5].name._M_str == 0)) {
          pDVar10 = ASTContext::addDiag((ASTContext *)call,outArgCode,
                                        *(SourceRange *)(*(long *)(lVar4 + lVar14) + 0x20));
          this_00 = Diagnostic::operator<<(pDVar10,pSVar13->name);
          Diagnostic::operator<<(this_00,*(string_view *)(*(long *)((long)ppFVar6 + lVar14) + 8));
          noteLocation = pSVar13->location;
          goto LAB_00489861;
        }
      }
      else if (iVar1 - 1U < 2) {
        pDVar10 = ASTContext::addDiag((ASTContext *)call,SUB84(context,0),range);
        noteLocation = *(SourceLocation *)(*(long *)((long)ppFVar6 + lVar14) + 0x18);
LAB_00489861:
        Diagnostic::addNote(pDVar10,(DiagCode)0x50001,noteLocation);
        return false;
      }
      lVar14 = lVar14 + 8;
    } while (sVar5 << 3 != lVar14);
  }
  return true;
}

Assistant:

bool AssertionExpr::checkAssertionCall(const CallExpression& call, const ASTContext& context,
                                       DiagCode outArgCode, DiagCode refArgCode,
                                       DiagCode nonVoidCode, SourceRange range,
                                       bool isInsideSequence) {
    if (isInsideSequence || call.isSystemCall()) {
        if (call.getSubroutineKind() == SubroutineKind::Function && !call.type->isVoid() &&
            !call.type->isError()) {
            context.addDiag(nonVoidCode, range) << call.getSubroutineName();
        }
    }

    if (call.isSystemCall()) {
        auto& sub = *std::get<1>(call.subroutine).subroutine;
        if (sub.hasOutputArgs) {
            context.addDiag(outArgCode, range);
            return false;
        }
    }
    else {
        auto& sub = *std::get<0>(call.subroutine);
        auto args = call.arguments();
        size_t index = 0;
        for (auto& formal : sub.getArguments()) {
            if (formal->direction == ArgumentDirection::Out ||
                formal->direction == ArgumentDirection::InOut) {
                auto& diag = context.addDiag(outArgCode, range);
                diag.addNote(diag::NoteDeclarationHere, formal->location);
                return false;
            }

            if (formal->direction == ArgumentDirection::Ref) {
                SLANG_ASSERT(index < args.size());
                if (auto sym = args[index]->getSymbolReference()) {
                    if (VariableSymbol::isKind(sym->kind) &&
                        sym->as<VariableSymbol>().lifetime == VariableLifetime::Automatic) {
                        auto& diag = context.addDiag(refArgCode, args[index]->sourceRange);
                        diag << sym->name << formal->name;
                        diag.addNote(diag::NoteDeclarationHere, sym->location);
                        return false;
                    }
                }
            }

            index++;
        }
    }

    return true;
}